

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basetableref.hpp
# Opt level: O2

void __thiscall duckdb::BaseTableRef::BaseTableRef(BaseTableRef *this)

{
  allocator local_1a;
  allocator local_19;
  
  (this->super_TableRef).type = BASE_TABLE;
  (this->super_TableRef).alias._M_dataplus._M_p = (pointer)&(this->super_TableRef).alias.field_2;
  (this->super_TableRef).alias._M_string_length = 0;
  (this->super_TableRef).alias.field_2._M_local_buf[0] = '\0';
  (this->super_TableRef).sample.
  super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
  super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>.
  super__Head_base<0UL,_duckdb::SampleOptions_*,_false>._M_head_impl = (SampleOptions *)0x0;
  (this->super_TableRef).query_location.index = 0xffffffffffffffff;
  (this->super_TableRef).external_dependency.internal.
  super___shared_ptr<duckdb::ExternalDependency,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_TableRef).external_dependency.internal.
  super___shared_ptr<duckdb::ExternalDependency,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_TableRef).column_name_alias.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_TableRef).column_name_alias.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_TableRef).column_name_alias.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_TableRef)._vptr_TableRef = (_func_int **)&PTR__BaseTableRef_027a9180;
  ::std::__cxx11::string::string((string *)&this->catalog_name,anon_var_dwarf_4b0ffdd + 9,&local_19)
  ;
  ::std::__cxx11::string::string((string *)&this->schema_name,anon_var_dwarf_4b0ffdd + 9,&local_1a);
  (this->table_name)._M_dataplus._M_p = (pointer)&(this->table_name).field_2;
  (this->table_name)._M_string_length = 0;
  (this->table_name).field_2._M_local_buf[0] = '\0';
  (this->at_clause).super_unique_ptr<duckdb::AtClause,_std::default_delete<duckdb::AtClause>_>._M_t.
  super___uniq_ptr_impl<duckdb::AtClause,_std::default_delete<duckdb::AtClause>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::AtClause_*,_std::default_delete<duckdb::AtClause>_>.
  super__Head_base<0UL,_duckdb::AtClause_*,_false>._M_head_impl = (AtClause *)0x0;
  return;
}

Assistant:

BaseTableRef()
	    : TableRef(TableReferenceType::BASE_TABLE), catalog_name(INVALID_CATALOG), schema_name(INVALID_SCHEMA) {
	}